

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::binaryOpVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numOperations,char *op)

{
  undefined4 in_register_00000014;
  char *local_98;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  int i;
  undefined1 local_21;
  char *local_20;
  char *op_local;
  string *psStack_10;
  int numOperations_local;
  string *resultTemplate;
  
  local_20 = (char *)CONCAT44(in_register_00000014,numOperations);
  op_local._4_4_ = (int)this;
  local_21 = 0;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "#version 300 es\nin highp vec4 a_position${NAME_SPEC};\nin mediump vec4 a_value${NAME_SPEC};\nout mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tmediump vec4 value = "
            );
  for (local_38 = 0; local_38 < op_local._4_4_; local_38 = local_38 + 1) {
    if (local_38 < 1) {
      local_98 = "";
    }
    else {
      local_98 = local_20;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_98,&local_79);
    std::operator+(&local_58,&local_78,"a_value${NAME_SPEC}");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             ";\n\tv_value${NAME_SPEC} = value;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  return __return_storage_ptr__;
}

Assistant:

static string binaryOpVertexTemplate (int numOperations, const char* op)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"in highp vec4 a_position${NAME_SPEC};\n"
		"in mediump vec4 a_value${NAME_SPEC};\n"
		"out mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	mediump vec4 value = ";

	for (int i = 0; i < numOperations; i++)
		resultTemplate += string(i > 0 ? op : "") + "a_value${NAME_SPEC}";

	resultTemplate +=
		";\n"
		"	v_value${NAME_SPEC} = value;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}